

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O3

int netaddr_to_socket(netaddr_socket *dst,netaddr *src)

{
  undefined8 uVar1;
  
  *(ushort *)dst = (ushort)src->_type;
  if (src->_type == '\n') {
    uVar1 = *(undefined8 *)(src->_addr + 8);
    *(undefined8 *)(dst->v4).sin_zero = *(undefined8 *)src->_addr;
    *(undefined8 *)((long)&(dst->v6).sin6_addr.__in6_u + 8) = uVar1;
  }
  else {
    if (src->_type != '\x02') {
      return -1;
    }
    (dst->v4).sin_addr.s_addr = *(in_addr_t *)src->_addr;
  }
  *(ushort *)dst = (ushort)src->_type;
  return 0;
}

Assistant:

int
netaddr_to_socket(union netaddr_socket *dst, const struct netaddr *src) {
  /* copy address type */
  dst->std.sa_family = src->_type;

  switch (src->_type) {
    case AF_INET:
      /* ipv4 */
      memcpy(&dst->v4.sin_addr, src->_addr, 4);
      break;
    case AF_INET6:
      /* ipv6 */
      memcpy(&dst->v6.sin6_addr, src->_addr, 16);
      break;
    default:
      /* unknown address type */
      return -1;
  }

  /* copy address type */
  dst->std.sa_family = src->_type;
  return 0;
}